

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOT<double>::TPZStructMatrixOT
          (TPZStructMatrixOT<double> *this,TPZStructMatrixOT<double> *copy)

{
  long *in_RSI;
  TPZVec<long> *in_RDI;
  pointer_____offset_0x68___ *copy_00;
  
  copy_00 = &VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_025664a0);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)(in_RDI + 4),(void **)&((TPZVec<long> *)copy_00)->fNAlloc,
             (TPZStrMatParInterface *)((long)in_RSI + *(long *)(*in_RSI + -0x60)));
  in_RDI->_vptr_TPZVec = (_func_int **)0x2566300;
  in_RDI[4]._vptr_TPZVec = (_func_int **)0x2566408;
  in_RDI->_vptr_TPZVec = (_func_int **)0x2566300;
  TPZVec<long>::TPZVec(in_RDI,(TPZVec<long> *)copy_00);
  TPZVec<long>::TPZVec(in_RDI,(TPZVec<long> *)copy_00);
  TPZVec<long>::TPZVec(in_RDI,(TPZVec<long> *)copy_00);
  in_RDI[3].fStore = (long *)in_RSI[0xd];
  return;
}

Assistant:

TPZStructMatrixOT<TVar>::TPZStructMatrixOT(const TPZStructMatrixOT &copy) :
    TPZStrMatParInterface(copy),
    fElBlocked(copy.fElBlocked),
    fElSequenceColor(copy.fElSequenceColor),
    fElementsComputed(copy.fElementsComputed),
    fElementCompleted(copy.fElementCompleted)
    //fSomeoneisSleeping //no need
    //fCurrentIndex //no need
{
}